

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reverb.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_1913a4::ReverbState::earlyFaded
          (ReverbState *this,size_t offset,size_t todo,float fade,float fadeStep)

{
  float xCoeff;
  float yCoeff;
  float fVar1;
  float fVar2;
  ulong uVar3;
  float *pfVar4;
  anon_unknown_dwarf_1913a4 *this_00;
  float *pfVar5;
  anon_unknown_dwarf_1913a4 *paVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  float *pfVar11;
  float *pfVar12;
  ulong uVar13;
  anon_union_4096_2_95c9c352_for_ReverbState_18 *paVar14;
  array<std::array<float,_256UL>,_4UL> *paVar15;
  size_t sVar16;
  anon_unknown_dwarf_1913a4 *in_R9;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  anon_union_4096_2_95c9c352_for_ReverbState_18 *samples;
  float fVar20;
  DelayLineI delay;
  long local_80;
  
  uVar3 = (this->mEarly).Delay.Mask;
  pfVar4 = ((this->mEarly).Delay.field_1.Line)->_M_elems;
  this_00 = (anon_unknown_dwarf_1913a4 *)(this->mDelay).Mask;
  pfVar5 = ((this->mDelay).field_1.Line)->_M_elems;
  xCoeff = this->mMixX;
  yCoeff = this->mMixY;
  samples = &this->field_15;
  local_80 = 0;
  pfVar12 = pfVar5;
  paVar14 = samples;
  do {
    if (todo != 0) {
      fVar1 = this->mEarlyDelayCoeff[local_80][0];
      fVar2 = this->mEarlyDelayCoeff[local_80][1];
      paVar6 = (anon_unknown_dwarf_1913a4 *)(offset - this->mEarlyDelayTap[local_80][1]);
      in_R9 = (anon_unknown_dwarf_1913a4 *)(offset - this->mEarlyDelayTap[local_80][0]);
      uVar18 = 0;
      fVar20 = fade;
      do {
        uVar17 = (ulong)in_R9 & (ulong)this_00;
        uVar7 = (ulong)paVar6 & (ulong)this_00;
        uVar13 = uVar7;
        if (uVar7 < uVar17) {
          uVar13 = uVar17;
        }
        paVar6 = (anon_unknown_dwarf_1913a4 *)(todo - uVar18);
        if (this_00 + (1 - uVar13) < (anon_unknown_dwarf_1913a4 *)(todo - uVar18)) {
          paVar6 = this_00 + (1 - uVar13);
        }
        in_R9 = (anon_unknown_dwarf_1913a4 *)0x0;
        pfVar11 = pfVar12;
        do {
          fVar20 = fVar20 + 1.0;
          *(float *)((long)paVar14 + (long)in_R9 * 4 + uVar18 * 4) =
               (-fVar1 * fadeStep * fVar20 + fVar1) *
               ((array<float,_4UL> *)((long)pfVar11 + uVar17 * 0x10))->_M_elems[0] +
               fVar2 * fadeStep * fVar20 *
               ((array<float,_4UL> *)((long)pfVar11 + uVar7 * 0x10))->_M_elems[0];
          in_R9 = in_R9 + 1;
          pfVar11 = (float *)((long)pfVar11 + 0x10);
        } while (paVar6 != in_R9);
        uVar18 = uVar18 + (long)in_R9;
        paVar6 = in_R9 + uVar7;
        in_R9 = in_R9 + uVar17;
      } while (uVar18 < todo);
    }
    local_80 = local_80 + 1;
    paVar14 = (anon_union_4096_2_95c9c352_for_ReverbState_18 *)((long)paVar14 + 0x400);
    pfVar12 = pfVar12 + 1;
  } while (local_80 != 4);
  VecAllpass::processFaded
            (&(this->mEarly).VecAp,(span<std::array<float,_256UL>,_4UL>)samples,offset,xCoeff,yCoeff
             ,fade,fadeStep,todo);
  local_80 = 0;
  pfVar12 = pfVar4;
  paVar15 = &this->mEarlySamples;
  do {
    if (todo != 0) {
      fVar1 = (this->mEarly).Coeff[local_80][0];
      fVar2 = (this->mEarly).Coeff[local_80][1];
      uVar18 = offset - (this->mEarly).Offset[local_80][1];
      uVar13 = offset - (this->mEarly).Offset[local_80][0];
      uVar7 = 0;
      fVar20 = fade;
      do {
        uVar13 = uVar13 & uVar3;
        uVar18 = uVar18 & uVar3;
        uVar17 = uVar18;
        if (uVar18 < uVar13) {
          uVar17 = uVar13;
        }
        uVar17 = (uVar3 + 1) - uVar17;
        uVar9 = todo - uVar7;
        if (uVar17 < todo - uVar7) {
          uVar9 = uVar17;
        }
        in_R9 = (anon_unknown_dwarf_1913a4 *)(uVar18 * 0x10);
        uVar17 = 0;
        pfVar11 = pfVar12;
        do {
          fVar20 = fVar20 + 1.0;
          paVar15->_M_elems[0]._M_elems[uVar7 + uVar17] =
               fVar2 * fadeStep * fVar20 *
               ((array<float,_4UL> *)((long)pfVar11 + uVar18 * 0x10))->_M_elems[0] +
               (-fVar1 * fadeStep * fVar20 + fVar1) *
               ((array<float,_4UL> *)((long)pfVar11 + uVar13 * 0x10))->_M_elems[0] +
               *(float *)((long)(paVar15 + -1) + uVar17 * 4 + uVar7 * 4);
          pfVar11 = (float *)((long)pfVar11 + 0x10);
          uVar17 = uVar17 + 1;
        } while (uVar9 != uVar17);
        uVar7 = uVar7 + uVar17;
        uVar18 = uVar18 + uVar17;
        uVar13 = uVar13 + uVar17;
      } while (uVar7 < todo);
    }
    local_80 = local_80 + 1;
    pfVar12 = pfVar12 + 1;
    paVar15 = (array<std::array<float,_256UL>,_4UL> *)(paVar15->_M_elems + 1);
  } while (local_80 != 4);
  lVar10 = (long)(pfVar4 + 3);
  lVar8 = 0;
  do {
    if (todo != 0) {
      uVar18 = 0;
      sVar16 = offset;
      do {
        uVar7 = sVar16 & uVar3;
        uVar17 = (uVar3 + 1) - uVar7;
        uVar13 = todo - uVar18;
        if (uVar17 < todo - uVar18) {
          uVar13 = uVar17;
        }
        in_R9 = (anon_unknown_dwarf_1913a4 *)0x0;
        lVar19 = 0;
        do {
          *(undefined4 *)(uVar7 * 0x10 + lVar10 + lVar19 * 4) =
               *(undefined4 *)((long)samples + lVar19 + uVar18 * 4);
          lVar19 = lVar19 + 4;
          in_R9 = in_R9 + -1;
        } while (-(long)in_R9 != uVar13);
        uVar18 = uVar18 - (long)in_R9;
        sVar16 = uVar7 - (long)in_R9;
      } while (uVar18 < todo);
    }
    lVar8 = lVar8 + 1;
    lVar10 = lVar10 + -4;
    samples = (anon_union_4096_2_95c9c352_for_ReverbState_18 *)((long)samples + 0x400);
  } while (lVar8 != 4);
  delay.field_1.Line = (array<float,_4UL> *)(offset - this->mLateFeedTap);
  delay.Mask = (size_t)pfVar5;
  VectorScatterRevDelayIn
            (this_00,delay,(size_t)&this->mEarlySamples,xCoeff,yCoeff,
             (span<const_std::array<float,_256UL>,_4UL>)todo,(size_t)in_R9);
  return;
}

Assistant:

void ReverbState::earlyFaded(const size_t offset, const size_t todo, const float fade,
    const float fadeStep)
{
    const DelayLineI early_delay{mEarly.Delay};
    const DelayLineI main_delay{mDelay};
    const float mixX{mMixX};
    const float mixY{mMixY};

    ASSUME(todo > 0);

    for(size_t j{0u};j < NUM_LINES;j++)
    {
        size_t early_delay_tap0{offset - mEarlyDelayTap[j][0]};
        size_t early_delay_tap1{offset - mEarlyDelayTap[j][1]};
        const float oldCoeff{mEarlyDelayCoeff[j][0]};
        const float oldCoeffStep{-oldCoeff * fadeStep};
        const float newCoeffStep{mEarlyDelayCoeff[j][1] * fadeStep};
        float fadeCount{fade};

        for(size_t i{0u};i < todo;)
        {
            early_delay_tap0 &= main_delay.Mask;
            early_delay_tap1 &= main_delay.Mask;
            size_t td{minz(main_delay.Mask+1 - maxz(early_delay_tap0, early_delay_tap1), todo-i)};
            do {
                fadeCount += 1.0f;
                const float fade0{oldCoeff + oldCoeffStep*fadeCount};
                const float fade1{newCoeffStep*fadeCount};
                mTempSamples[j][i++] =
                    main_delay.Line[early_delay_tap0++][j]*fade0 +
                    main_delay.Line[early_delay_tap1++][j]*fade1;
            } while(--td);
        }
    }

    mEarly.VecAp.processFaded(mTempSamples, offset, mixX, mixY, fade, fadeStep, todo);

    for(size_t j{0u};j < NUM_LINES;j++)
    {
        size_t feedb_tap0{offset - mEarly.Offset[j][0]};
        size_t feedb_tap1{offset - mEarly.Offset[j][1]};
        const float feedb_oldCoeff{mEarly.Coeff[j][0]};
        const float feedb_oldCoeffStep{-feedb_oldCoeff * fadeStep};
        const float feedb_newCoeffStep{mEarly.Coeff[j][1] * fadeStep};
        float *out{mEarlySamples[j].data()};
        float fadeCount{fade};

        for(size_t i{0u};i < todo;)
        {
            feedb_tap0 &= early_delay.Mask;
            feedb_tap1 &= early_delay.Mask;
            size_t td{minz(early_delay.Mask+1 - maxz(feedb_tap0, feedb_tap1), todo - i)};

            do {
                fadeCount += 1.0f;
                const float fade0{feedb_oldCoeff + feedb_oldCoeffStep*fadeCount};
                const float fade1{feedb_newCoeffStep*fadeCount};
                out[i] = mTempSamples[j][i] +
                    early_delay.Line[feedb_tap0++][j]*fade0 +
                    early_delay.Line[feedb_tap1++][j]*fade1;
                ++i;
            } while(--td);
        }
    }
    for(size_t j{0u};j < NUM_LINES;j++)
        early_delay.write(offset, NUM_LINES-1-j, mTempSamples[j].data(), todo);

    const size_t late_feed_tap{offset - mLateFeedTap};
    VectorScatterRevDelayIn(main_delay, late_feed_tap, mixX, mixY, mEarlySamples, todo);
}